

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_arange.c
# Opt level: O1

void free_aranges_chain(Dwarf_Debug dbg,Dwarf_Chain_conflict head)

{
  Dwarf_Chain pDVar1;
  Dwarf_Chain_conflict cur;
  
  if (head != (Dwarf_Chain_conflict)0x0) {
    do {
      pDVar1 = head->ch_next;
      if (head->ch_itemtype != 0 && head->ch_item != (Dwarf_Ptr)0x0) {
        dwarf_dealloc(dbg,head->ch_item,(long)head->ch_itemtype);
        head->ch_item = (void *)0x0;
        dwarf_dealloc(dbg,head,0x1f);
      }
      head = pDVar1;
    } while (pDVar1 != (Dwarf_Chain)0x0);
  }
  return;
}

Assistant:

static void
free_aranges_chain(Dwarf_Debug dbg, Dwarf_Chain head)
{
    Dwarf_Chain cur = head;
    Dwarf_Chain next = 0;

    if (!head) {
        return;
    }
    next = head->ch_next;
    for ( ;cur; cur = next) {
        void *item = cur->ch_item;
        int  type = cur->ch_itemtype;

        next = cur->ch_next;
        if (item && type) {
            dwarf_dealloc(dbg,item,type);
            cur->ch_item = 0;
            dwarf_dealloc(dbg,cur,DW_DLA_CHAIN);
        }
    }
}